

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::checkArraySubscript(ArrayElementRef *s)

{
  bool bVar1;
  Expression *e;
  pool_ptr<soul::AST::Expression> local_10;
  
  local_10.object = (s->object).object;
  bVar1 = AST::isResolvedAsEndpoint(&local_10);
  if (!bVar1) {
    e = pool_ptr<soul::AST::Expression>::operator*(&s->object);
    throwErrorIfNotArrayOrVector(e);
  }
  return;
}

Assistant:

static void checkArraySubscript (AST::ArrayElementRef& s)
    {
        if (! AST::isResolvedAsEndpoint (s.object))
            throwErrorIfNotArrayOrVector (*s.object);
    }